

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_wav__on_write_memory(void *pUserData,void *pDataIn,size_t bytesToWrite)

{
  ulong szNew;
  void *pvVar1;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t newDataCapacity;
  void *pNewData;
  size_t bytesRemaining;
  ma_dr_wav *pWav;
  ma_allocation_callbacks *local_48;
  size_t in_stack_ffffffffffffffc8;
  
  szNew = *(long *)((long)in_RDI + 0xf0) - *(long *)((long)in_RDI + 0xf8);
  if (szNew < in_RDX) {
    if (*(long *)((long)in_RDI + 0xf0) == 0) {
      local_48 = (ma_allocation_callbacks *)0x100;
    }
    else {
      local_48 = (ma_allocation_callbacks *)(*(long *)((long)in_RDI + 0xf0) << 1);
    }
    if ((ulong)((long)local_48 - *(long *)((long)in_RDI + 0xf8)) < in_RDX) {
      local_48 = (ma_allocation_callbacks *)(*(long *)((long)in_RDI + 0xf8) + in_RDX);
    }
    pvVar1 = ma_dr_wav__realloc_from_callbacks(in_RDI,szNew,in_stack_ffffffffffffffc8,local_48);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    **(undefined8 **)((long)in_RDI + 0xd8) = pvVar1;
    *(ma_allocation_callbacks **)((long)in_RDI + 0xf0) = local_48;
  }
  memcpy((void *)(**(long **)((long)in_RDI + 0xd8) + *(long *)((long)in_RDI + 0xf8)),in_RSI,in_RDX);
  *(ulong *)((long)in_RDI + 0xf8) = in_RDX + *(long *)((long)in_RDI + 0xf8);
  if (*(ulong *)((long)in_RDI + 0xe8) < *(ulong *)((long)in_RDI + 0xf8)) {
    *(undefined8 *)((long)in_RDI + 0xe8) = *(undefined8 *)((long)in_RDI + 0xf8);
  }
  **(undefined8 **)((long)in_RDI + 0xe0) = *(undefined8 *)((long)in_RDI + 0xe8);
  return in_RDX;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__on_write_memory(void* pUserData, const void* pDataIn, size_t bytesToWrite)
{
    ma_dr_wav* pWav = (ma_dr_wav*)pUserData;
    size_t bytesRemaining;
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(pWav->memoryStreamWrite.dataCapacity >= pWav->memoryStreamWrite.currentWritePos);
    bytesRemaining = pWav->memoryStreamWrite.dataCapacity - pWav->memoryStreamWrite.currentWritePos;
    if (bytesRemaining < bytesToWrite) {
        void* pNewData;
        size_t newDataCapacity = (pWav->memoryStreamWrite.dataCapacity == 0) ? 256 : pWav->memoryStreamWrite.dataCapacity * 2;
        if ((newDataCapacity - pWav->memoryStreamWrite.currentWritePos) < bytesToWrite) {
            newDataCapacity = pWav->memoryStreamWrite.currentWritePos + bytesToWrite;
        }
        pNewData = ma_dr_wav__realloc_from_callbacks(*pWav->memoryStreamWrite.ppData, newDataCapacity, pWav->memoryStreamWrite.dataCapacity, &pWav->allocationCallbacks);
        if (pNewData == NULL) {
            return 0;
        }
        *pWav->memoryStreamWrite.ppData = pNewData;
        pWav->memoryStreamWrite.dataCapacity = newDataCapacity;
    }
    MA_DR_WAV_COPY_MEMORY(((ma_uint8*)(*pWav->memoryStreamWrite.ppData)) + pWav->memoryStreamWrite.currentWritePos, pDataIn, bytesToWrite);
    pWav->memoryStreamWrite.currentWritePos += bytesToWrite;
    if (pWav->memoryStreamWrite.dataSize < pWav->memoryStreamWrite.currentWritePos) {
        pWav->memoryStreamWrite.dataSize = pWav->memoryStreamWrite.currentWritePos;
    }
    *pWav->memoryStreamWrite.pDataSize = pWav->memoryStreamWrite.dataSize;
    return bytesToWrite;
}